

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_group_scrolled_offset_begin
              (nk_context *ctx,nk_uint *x_offset,nk_uint *y_offset,char *title,nk_flags flags)

{
  float fVar1;
  uint uVar2;
  nk_window *pnVar3;
  nk_panel *pnVar4;
  float fVar5;
  float fVar6;
  nk_rect bounds;
  nk_window panel;
  
  pnVar3 = ctx->current;
  nk_panel_alloc_space(&bounds,ctx);
  pnVar4 = pnVar3->layout;
  fVar1 = (pnVar4->clip).x;
  if ((((pnVar4->clip).w + fVar1 < bounds.x) || (bounds.x + bounds.w < fVar1)) ||
     (fVar1 = (pnVar4->clip).y, (pnVar4->clip).h + fVar1 < bounds.y)) {
    if ((flags & 2) != 0) goto LAB_001370db;
  }
  else if (((flags & 2) != 0) || (fVar1 <= bounds.y + bounds.h)) {
LAB_001370db:
    uVar2 = pnVar3->flags;
    nk_zero(&panel,0x1d8);
    panel.scrollbar.x = *x_offset;
    panel.scrollbar.y = *y_offset;
    panel.buffer.base = (pnVar3->buffer).base;
    panel.buffer.clip.x = (pnVar3->buffer).clip.x;
    panel.buffer.clip.y = (pnVar3->buffer).clip.y;
    panel.buffer.clip.w = (pnVar3->buffer).clip.w;
    panel.buffer.clip.h = (pnVar3->buffer).clip.h;
    panel.buffer.use_clipping = (pnVar3->buffer).use_clipping;
    panel.buffer._28_4_ = *(undefined4 *)&(pnVar3->buffer).field_0x1c;
    panel.buffer.userdata = (pnVar3->buffer).userdata;
    panel.buffer.begin = (pnVar3->buffer).begin;
    panel.buffer.end = (pnVar3->buffer).end;
    panel.buffer.last = (pnVar3->buffer).last;
    panel.flags = uVar2 & 0x1000 | flags;
    panel.layout = (nk_panel *)nk_create_panel(ctx);
    ctx->current = &panel;
    if ((flags & 0x40) == 0) {
      title = (char *)0x0;
    }
    nk_panel_begin(ctx,title,NK_PANEL_GROUP);
    (pnVar3->buffer).end = panel.buffer.end;
    (pnVar3->buffer).last = panel.buffer.last;
    (pnVar3->buffer).userdata = panel.buffer.userdata;
    (pnVar3->buffer).begin = panel.buffer.begin;
    (pnVar3->buffer).clip.w = panel.buffer.clip.w;
    (pnVar3->buffer).clip.h = panel.buffer.clip.h;
    (pnVar3->buffer).use_clipping = panel.buffer.use_clipping;
    *(undefined4 *)&(pnVar3->buffer).field_0x1c = panel.buffer._28_4_;
    (pnVar3->buffer).base = panel.buffer.base;
    (pnVar3->buffer).clip.x = panel.buffer.clip.x;
    (pnVar3->buffer).clip.y = panel.buffer.clip.y;
    fVar1 = ((panel.layout)->clip).y;
    fVar5 = ((panel.layout)->clip).w;
    fVar6 = ((panel.layout)->clip).h;
    (pnVar3->buffer).clip.x = ((panel.layout)->clip).x;
    (pnVar3->buffer).clip.y = fVar1;
    (pnVar3->buffer).clip.w = fVar5;
    (pnVar3->buffer).clip.h = fVar6;
    (panel.layout)->offset_x = x_offset;
    (panel.layout)->offset_y = y_offset;
    (panel.layout)->parent = pnVar3->layout;
    pnVar3->layout = panel.layout;
    ctx->current = pnVar3;
    uVar2 = (panel.layout)->flags;
    if ((uVar2 & 0xc000) != 0) {
      nk_group_scrolled_end(ctx);
      return (uint)((uVar2 >> 0xe & 1) == 0) * 0x4000 + 0x4000;
    }
    return 1;
  }
  return 0;
}

Assistant:

NK_API int
nk_group_scrolled_offset_begin(struct nk_context *ctx,
    nk_uint *x_offset, nk_uint *y_offset, const char *title, nk_flags flags)
{
    struct nk_rect bounds;
    struct nk_window panel;
    struct nk_window *win;

    win = ctx->current;
    nk_panel_alloc_space(&bounds, ctx);
    {const struct nk_rect *c = &win->layout->clip;
    if (!NK_INTERSECT(c->x, c->y, c->w, c->h, bounds.x, bounds.y, bounds.w, bounds.h) &&
        !(flags & NK_WINDOW_MOVABLE)) {
        return 0;
    }}
    if (win->flags & NK_WINDOW_ROM)
        flags |= NK_WINDOW_ROM;

    /* initialize a fake window to create the panel from */
    nk_zero(&panel, sizeof(panel));
    panel.bounds = bounds;
    panel.flags = flags;
    panel.scrollbar.x = *x_offset;
    panel.scrollbar.y = *y_offset;
    panel.buffer = win->buffer;
    panel.layout = (struct nk_panel*)nk_create_panel(ctx);
    ctx->current = &panel;
    nk_panel_begin(ctx, (flags & NK_WINDOW_TITLE) ? title: 0, NK_PANEL_GROUP);

    win->buffer = panel.buffer;
    win->buffer.clip = panel.layout->clip;
    panel.layout->offset_x = x_offset;
    panel.layout->offset_y = y_offset;
    panel.layout->parent = win->layout;
    win->layout = panel.layout;

    ctx->current = win;
    if ((panel.layout->flags & NK_WINDOW_CLOSED) ||
        (panel.layout->flags & NK_WINDOW_MINIMIZED))
    {
        nk_flags f = panel.layout->flags;
        nk_group_scrolled_end(ctx);
        if (f & NK_WINDOW_CLOSED)
            return NK_WINDOW_CLOSED;
        if (f & NK_WINDOW_MINIMIZED)
            return NK_WINDOW_MINIMIZED;
    }
    return 1;
}